

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::PrintStats(LinearScan *this)

{
  Opnd *pOVar1;
  _func_int **pp_Var2;
  BranchInstr *pBVar3;
  code *pcVar4;
  int iVar5;
  char cVar6;
  bool bVar7;
  IRKind IVar8;
  OpndKind OVar9;
  uint uVar10;
  uint uVar11;
  undefined4 *puVar12;
  uint uVar13;
  BranchInstr *pBVar14;
  byte bVar15;
  BranchInstr *this_00;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  this_00 = (BranchInstr *)this->func->m_tailInstr;
  if (this_00 == (BranchInstr *)0x0) {
    local_38 = 0;
    local_34 = 0;
    uVar10 = 0;
    local_3c = 0;
    uVar11 = 0;
  }
  else {
    uVar13 = 0;
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_38 = 0;
    local_34 = 0;
    uVar10 = 0;
    bVar15 = 0;
    local_3c = 0;
    uVar11 = 0;
    pBVar14 = (BranchInstr *)0x0;
    do {
      if ((pBVar14 != (BranchInstr *)0x0) &&
         ((BranchInstr *)(pBVar14->super_Instr).m_prev != this_00)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x1274,
                           "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar7) goto LAB_0058148d;
        *puVar12 = 0;
      }
      IVar8 = (this_00->super_Instr).m_kind;
      switch(IVar8) {
      case InstrKindBranch:
        bVar7 = IR::BranchInstr::IsLoopTail(this_00,this->func);
        uVar13 = uVar13 + bVar7;
        local_3c = local_3c + 1;
        break;
      case InstrKindLabel:
      case InstrKindProfiledLabel:
        if (((ulong)this_00[1].super_Instr._vptr_Instr & 1) != 0) {
          if (uVar13 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x1288,"(loopNest)","loopNest");
            if (!bVar7) goto LAB_0058148d;
            *puVar12 = 0;
            IVar8 = (this_00->super_Instr).m_kind;
          }
          uVar13 = uVar13 - 1;
        }
        if ((IVar8 != InstrKindLabel) && (IVar8 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar7) goto LAB_0058148d;
          *puVar12 = 0;
        }
        bVar15 = *(byte *)&this_00[1].super_Instr._vptr_Instr >> 1;
        break;
      default:
        bVar7 = IR::Instr::IsRealInstr(&this_00->super_Instr);
        if (!bVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x1291,"(instr->IsRealInstr())","instr->IsRealInstr()");
          if (!bVar7) goto LAB_0058148d;
          *puVar12 = 0;
        }
        if ((bVar15 & 1) == 0) {
          pOVar1 = (this_00->super_Instr).m_dst;
          cVar6 = (char)uVar13;
          if ((pOVar1 != (Opnd *)0x0) && (OVar9 = IR::Opnd::GetKind(pOVar1), OVar9 == OpndKindSym))
          {
            OVar9 = IR::Opnd::GetKind(pOVar1);
            if (OVar9 != OpndKindSym) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
              if (!bVar7) goto LAB_0058148d;
              *puVar12 = 0;
            }
            if (*(char *)((long)pOVar1[1]._vptr_Opnd + 0x14) == '\x01') {
              OVar9 = IR::Opnd::GetKind(pOVar1);
              if (OVar9 != OpndKindSym) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                if (!bVar7) goto LAB_0058148d;
                *puVar12 = 0;
              }
              pp_Var2 = pOVar1[1]._vptr_Opnd;
              if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                   ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                if (!bVar7) goto LAB_0058148d;
                *puVar12 = 0;
              }
              if ((*(byte *)((long)pp_Var2 + 0x19) & 0x10) != 0) {
                local_38 = local_38 + 1;
                iVar5 = uVar13 * 0x8000 + -0x28000;
                if (uVar13 < 6) {
                  iVar5 = 1 << (cVar6 * '\x03' & 0x1fU);
                }
                uVar10 = uVar10 + iVar5;
              }
            }
          }
          pOVar1 = (this_00->super_Instr).m_src1;
          if (pOVar1 != (Opnd *)0x0) {
            OVar9 = IR::Opnd::GetKind(pOVar1);
            if (OVar9 == OpndKindSym) {
              OVar9 = IR::Opnd::GetKind(pOVar1);
              if (OVar9 != OpndKindSym) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                if (!bVar7) goto LAB_0058148d;
                *puVar12 = 0;
              }
              if (*(char *)((long)pOVar1[1]._vptr_Opnd + 0x14) == '\x01') {
                OVar9 = IR::Opnd::GetKind(pOVar1);
                if (OVar9 != OpndKindSym) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                  if (!bVar7) goto LAB_0058148d;
                  *puVar12 = 0;
                }
                pp_Var2 = pOVar1[1]._vptr_Opnd;
                if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                     ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                  if (!bVar7) goto LAB_0058148d;
                  *puVar12 = 0;
                }
                if ((*(byte *)((long)pp_Var2 + 0x19) & 0x10) != 0) {
                  local_34 = local_34 + 1;
                  iVar5 = uVar13 * 0x8000 + -0x28000;
                  if (uVar13 < 6) {
                    iVar5 = 1 << (cVar6 * '\x03' & 0x1fU);
                  }
                  uVar11 = uVar11 + iVar5;
                }
              }
            }
            pOVar1 = (this_00->super_Instr).m_src2;
            if ((pOVar1 != (Opnd *)0x0) && (OVar9 = IR::Opnd::GetKind(pOVar1), OVar9 == OpndKindSym)
               ) {
              OVar9 = IR::Opnd::GetKind(pOVar1);
              if (OVar9 != OpndKindSym) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                if (!bVar7) goto LAB_0058148d;
                *puVar12 = 0;
              }
              if (*(char *)((long)pOVar1[1]._vptr_Opnd + 0x14) == '\x01') {
                OVar9 = IR::Opnd::GetKind(pOVar1);
                if (OVar9 != OpndKindSym) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                  if (!bVar7) goto LAB_0058148d;
                  *puVar12 = 0;
                }
                pp_Var2 = pOVar1[1]._vptr_Opnd;
                if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                     ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                  if (!bVar7) goto LAB_0058148d;
                  *puVar12 = 0;
                }
                if ((*(byte *)((long)pp_Var2 + 0x19) & 0x10) != 0) {
                  local_34 = local_34 + 1;
                  iVar5 = uVar13 * 0x8000 + -0x28000;
                  if (uVar13 < 6) {
                    iVar5 = 1 << (cVar6 * '\x03' & 0x1fU);
                  }
                  uVar11 = uVar11 + iVar5;
                }
              }
            }
          }
        }
        break;
      case InstrKindPragma:
        break;
      }
      pBVar3 = (BranchInstr *)(this_00->super_Instr).m_prev;
      pBVar14 = this_00;
      this_00 = pBVar3;
    } while (pBVar3 != (BranchInstr *)0x0);
    if (uVar13 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x12b2,"(loopNest == 0)","loopNest == 0");
      if (!bVar7) {
LAB_0058148d:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar12 = 0;
    }
  }
  Func::DumpFullFunctionName(this->func);
  Output::SkipToColumn(0x2d);
  Output::Print(L"Instrs:%5d, Lds:%4d, Strs:%4d, WLds: %4d, WStrs: %4d, WRefs: %4d\n",
                (ulong)local_3c,(ulong)local_34,(ulong)local_38,(ulong)uVar11,(ulong)uVar10,
                uVar10 + uVar11);
  return;
}

Assistant:

void LinearScan::PrintStats() const
{
    uint loopNest = 0;
    uint storeCount = 0;
    uint loadCount = 0;
    uint wStoreCount = 0;
    uint wLoadCount = 0;
    uint instrCount = 0;
    bool isInHelper = false;

    FOREACH_INSTR_IN_FUNC_BACKWARD(instr, this->func)
    {
        switch (instr->GetKind())
        {
        case IR::InstrKindPragma:
            continue;

        case IR::InstrKindBranch:
            if (instr->AsBranchInstr()->IsLoopTail(this->func))
            {
                loopNest++;
            }

            instrCount++;
            break;

        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                Assert(loopNest);
                loopNest--;
            }

            isInHelper = instr->AsLabelInstr()->isOpHelper;
            break;

        default:
            {
                Assert(instr->IsRealInstr());

                if (isInHelper)
                {
                    continue;
                }

                IR::Opnd *dst = instr->GetDst();
                if (dst && dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsStackSym() && dst->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                {
                    storeCount++;
                    wStoreCount += LinearScan::GetUseSpillCost(loopNest, false);
                }
                IR::Opnd *src1 = instr->GetSrc1();
                if (src1)
                {
                    if (src1->IsSymOpnd() && src1->AsSymOpnd()->m_sym->IsStackSym() && src1->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                    {
                        loadCount++;
                        wLoadCount += LinearScan::GetUseSpillCost(loopNest, false);
                    }
                    IR::Opnd *src2 = instr->GetSrc2();
                    if (src2 && src2->IsSymOpnd() && src2->AsSymOpnd()->m_sym->IsStackSym() && src2->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                    {
                        loadCount++;
                        wLoadCount += LinearScan::GetUseSpillCost(loopNest, false);
                    }
                }
            }
            break;
        }
    } NEXT_INSTR_IN_FUNC_BACKWARD;

    Assert(loopNest == 0);

    this->func->DumpFullFunctionName();
    Output::SkipToColumn(45);

    Output::Print(_u("Instrs:%5d, Lds:%4d, Strs:%4d, WLds: %4d, WStrs: %4d, WRefs: %4d\n"),
        instrCount, loadCount, storeCount, wLoadCount, wStoreCount, wLoadCount+wStoreCount);
}